

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::DynamicMapField::AllocateMapValue
          (DynamicMapField *this,MapValueRef *map_val)

{
  CppType CVar1;
  int iVar2;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  long *val;
  uint *val_00;
  unsigned_long *val_01;
  double *val_02;
  float *val_03;
  bool *val_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val_05;
  int *piVar3;
  Reflection *this_02;
  Message *pMVar4;
  undefined4 extraout_var;
  Message *value_9;
  Message *message;
  int32_t *value_8;
  string *value_7;
  bool *value_6;
  float *value_5;
  double *value_4;
  uint64_t *value_3;
  uint32_t *value_2;
  int64_t *value_1;
  int32_t *value;
  FieldDescriptor *val_des;
  MapValueRef *map_val_local;
  DynamicMapField *this_local;
  
  this_00 = Message::GetDescriptor(this->default_entry_);
  this_01 = Descriptor::map_value(this_00);
  CVar1 = FieldDescriptor::cpp_type(this_01);
  MapValueConstRef::SetType(&map_val->super_MapValueConstRef,CVar1);
  CVar1 = FieldDescriptor::cpp_type(this_01);
  switch(CVar1) {
  case CPPTYPE_INT32:
    piVar3 = Arena::Create<int>((this->
                                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                ).super_MapFieldBase.arena_);
    MapValueConstRef::SetValue(&map_val->super_MapValueConstRef,piVar3);
    break;
  case CPPTYPE_INT64:
    val = Arena::Create<long>((this->
                              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                              ).super_MapFieldBase.arena_);
    MapValueConstRef::SetValue(&map_val->super_MapValueConstRef,val);
    break;
  case CPPTYPE_UINT32:
    val_00 = Arena::Create<unsigned_int>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    MapValueConstRef::SetValue(&map_val->super_MapValueConstRef,val_00);
    break;
  case CPPTYPE_UINT64:
    val_01 = Arena::Create<unsigned_long>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    MapValueConstRef::SetValue(&map_val->super_MapValueConstRef,val_01);
    break;
  case CPPTYPE_DOUBLE:
    val_02 = Arena::Create<double>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    MapValueConstRef::SetValue(&map_val->super_MapValueConstRef,val_02);
    break;
  case CPPTYPE_FLOAT:
    val_03 = Arena::Create<float>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    MapValueConstRef::SetValue(&map_val->super_MapValueConstRef,val_03);
    break;
  case CPPTYPE_BOOL:
    val_04 = Arena::Create<bool>((this->
                                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                 ).super_MapFieldBase.arena_);
    MapValueConstRef::SetValue(&map_val->super_MapValueConstRef,val_04);
    break;
  case CPPTYPE_ENUM:
    piVar3 = Arena::Create<int>((this->
                                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                ).super_MapFieldBase.arena_);
    MapValueConstRef::SetValue(&map_val->super_MapValueConstRef,piVar3);
    break;
  case CPPTYPE_STRING:
    val_05 = Arena::Create<std::__cxx11::string>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    MapValueConstRef::SetValue(&map_val->super_MapValueConstRef,val_05);
    break;
  case CPPTYPE_MESSAGE:
    this_02 = Message::GetReflection(this->default_entry_);
    pMVar4 = Reflection::GetMessage(this_02,this->default_entry_,this_01,(MessageFactory *)0x0);
    iVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])
                      (pMVar4,(this->
                              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                              ).super_MapFieldBase.arena_);
    MapValueConstRef::SetValue
              (&map_val->super_MapValueConstRef,(void *)CONCAT44(extraout_var,iVar2));
  }
  return;
}

Assistant:

void DynamicMapField::AllocateMapValue(MapValueRef* map_val) {
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  map_val->SetType(val_des->cpp_type());
  // Allocate memory for the MapValueRef, and initialize to
  // default value.
  switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    map_val->SetValue(value);                                \
    break;                                                   \
  }
    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(STRING, std::string);
    HANDLE_TYPE(ENUM, int32_t);
#undef HANDLE_TYPE
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      const Message& message =
          default_entry_->GetReflection()->GetMessage(*default_entry_, val_des);
      Message* value = message.New(MapFieldBase::arena_);
      map_val->SetValue(value);
      break;
    }
  }
}